

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

char * x509v3_bytes_to_hex(uint8_t *in,size_t len)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  uint8_t *ret;
  size_t unused_len;
  CBB cbb;
  uint8_t *local_70;
  size_t local_68;
  CBB local_60;
  
  iVar1 = CBB_init(&local_60,len * 3 + 1);
  if (iVar1 != 0) {
    bVar3 = len != 0;
    if (bVar3) {
      uVar2 = 1;
      do {
        if ((((uVar2 != 1) && (iVar1 = CBB_add_u8(&local_60,':'), iVar1 == 0)) ||
            (iVar1 = CBB_add_u8(&local_60,"0123456789ABCDEF"[in[uVar2 - 1] >> 4]), iVar1 == 0)) ||
           (iVar1 = CBB_add_u8(&local_60,"0123456789ABCDEF"[in[uVar2 - 1] & 0xf]), iVar1 == 0)) {
          if (bVar3) goto LAB_001ac91e;
          break;
        }
        bVar3 = uVar2 < len;
        bVar4 = uVar2 != len;
        uVar2 = uVar2 + 1;
      } while (bVar4);
    }
    iVar1 = CBB_add_u8(&local_60,'\0');
    if ((iVar1 != 0) && (iVar1 = CBB_finish(&local_60,&local_70,&local_68), iVar1 != 0)) {
      return (char *)local_70;
    }
  }
LAB_001ac91e:
  CBB_cleanup(&local_60);
  return (char *)0x0;
}

Assistant:

char *x509v3_bytes_to_hex(const uint8_t *in, size_t len) {
  CBB cbb;
  if (!CBB_init(&cbb, len * 3 + 1)) {
    goto err;
  }
  for (size_t i = 0; i < len; i++) {
    static const char hex[] = "0123456789ABCDEF";
    if ((i > 0 && !CBB_add_u8(&cbb, ':')) ||
        !CBB_add_u8(&cbb, hex[in[i] >> 4]) ||
        !CBB_add_u8(&cbb, hex[in[i] & 0xf])) {
      goto err;
    }
  }
  uint8_t *ret;
  size_t unused_len;
  if (!CBB_add_u8(&cbb, 0) || !CBB_finish(&cbb, &ret, &unused_len)) {
    goto err;
  }

  return (char *)ret;

err:
  CBB_cleanup(&cbb);
  return NULL;
}